

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O3

void generateVelocypack<JSONFormat>(BuilderContext *ctx)

{
  result_type_conflict rVar1;
  
  do {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(&(ctx->randomGenerator).mt64);
    if (ctx->recursionDepth < 0xb) break;
  } while (rVar1 % 7 < 2);
  (*(code *)(&DAT_0011a004 + *(int *)(&DAT_0011a004 + (rVar1 % 7) * 4)))();
  return;
}

Assistant:

static void generateVelocypack(BuilderContext& ctx) {
  constexpr RandomBuilderAdditions maxValue = maxRandomType<Format>();

  using limits = KnownLimitValues;

  Builder& builder = ctx.builder;
  RandomGenerator& randomGenerator = ctx.randomGenerator;

  while (true) {
    RandomBuilderAdditions randomBuilderAdds =
        static_cast<RandomBuilderAdditions>(randomGenerator.mt64() % maxValue);
    if (ctx.recursionDepth > limits::maxDepth &&
        randomBuilderAdds <= ADD_OBJECT) {
      continue;
    }
    switch (randomBuilderAdds) {
      case ADD_ARRAY: {
        builder.openArray(randomGenerator.mt64() % 2 ? true : false);
        uint32_t numMembers = randomGenerator.mt64() % limits::arrayNumMembers;
        for (uint32_t i = 0; i < numMembers; ++i) {
          ++ctx.recursionDepth;
          generateVelocypack<Format>(ctx);
          --ctx.recursionDepth;
        }
        builder.close();
        break;
      }
      case ADD_OBJECT: {
        builder.openObject(randomGenerator.mt64() % 2 ? true : false);
        uint32_t numMembers = randomGenerator.mt64() % limits::objNumMembers;
        if (ctx.tempObjectKeys.size() <= ctx.recursionDepth) {
          ctx.tempObjectKeys.resize(ctx.recursionDepth + 1);
        } else {
          ctx.tempObjectKeys[ctx.recursionDepth].clear();
        }
        VELOCYPACK_ASSERT(ctx.tempObjectKeys.size() > ctx.recursionDepth);
        ++ctx.recursionDepth;
        for (uint32_t i = 0; i < numMembers; ++i) {
          while (true) {
            ctx.tempString.clear();
            generateUtf8String(randomGenerator, ctx.tempString);
            if (ctx.tempObjectKeys[ctx.recursionDepth - 1]
                    .emplace(ctx.tempString)
                    .second) {
              break;
            }
          }
          // key
          builder.add(Value(ctx.tempString));
          // value
          generateVelocypack<Format>(ctx);
        }
        --ctx.recursionDepth;
        ctx.tempObjectKeys[ctx.recursionDepth].clear();
        builder.close();
        break;
      }
      case ADD_BOOLEAN:
        builder.add(Value(randomGenerator.mt64() % 2 ? true : false));
        break;
      case ADD_STRING: {
        ctx.tempString.clear();
        generateUtf8String(randomGenerator, ctx.tempString);
        builder.add(Value(ctx.tempString));
        break;
      }
      case ADD_NULL:
        builder.add(Value(ValueType::Null));
        break;
      case ADD_UINT64: {
        uint64_t value = randomGenerator.mt64();
        builder.add(Value(value));
        break;
      }
      case ADD_INT64: {
        uint64_t uintValue = randomGenerator.mt64();
        int64_t intValue;
        memcpy(&intValue, &uintValue, sizeof(uintValue));
        builder.add(Value(intValue));
        break;
      }
      case ADD_DOUBLE: {
        double doubleValue;
        do {
          uint64_t uintValue = randomGenerator.mt64();
          memcpy(&doubleValue, &uintValue, sizeof(uintValue));
        } while (!std::isfinite(doubleValue));
        builder.add(Value(doubleValue));
        break;
      }
      case ADD_UTC_DATE: {
        uint64_t utcDateValue = randomGenerator.mt64();
        builder.add(Value(utcDateValue, ValueType::UTCDate));
        break;
      }
      case ADD_BINARY: {
        ctx.tempString.clear();
        generateRandBinary(randomGenerator, ctx.tempString);
        builder.add(ValuePair(ctx.tempString.data(), ctx.tempString.size(),
                              ValueType::Binary));
        break;
      }
      case ADD_EXTERNAL: {
        builder.add(
            Value(static_cast<void const*>(&nullSlice), ValueType::External));
        break;
      }
      case ADD_ILLEGAL:
        builder.add(Value(ValueType::Illegal));
        break;
      case ADD_MIN_KEY:
        builder.add(Value(ValueType::MinKey));
        break;
      case ADD_MAX_KEY:
        builder.add(Value(ValueType::MaxKey));
        break;
      default:
        VELOCYPACK_ASSERT(false);
    }
    break;
  }
}